

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O2

void __thiscall lunasvg::SVGUseElement::build(SVGUseElement *this)

{
  SVGNode *pSVar1;
  pointer __p;
  SVGElement *pSVar2;
  _Head_base<0UL,_lunasvg::SVGNode_*,_false> local_20;
  SVGNode *local_18;
  
  pSVar2 = SVGURIReference::getTargetElement
                     (&this->super_SVGURIReference,
                      (this->super_SVGGraphicsElement).super_SVGElement.super_SVGNode.m_document);
  if (pSVar2 != (SVGElement *)0x0) {
    cloneTargetElement((SVGUseElement *)&stack0xffffffffffffffe8,(SVGElement *)this);
    pSVar1 = local_18;
    if (local_18 != (SVGNode *)0x0) {
      local_18 = (SVGNode *)0x0;
      local_20._M_head_impl = pSVar1;
      SVGElement::addChild
                ((SVGElement *)this,
                 (unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_> *)&local_20);
      if (local_20._M_head_impl != (SVGNode *)0x0) {
        (*(local_20._M_head_impl)->_vptr_SVGNode[1])();
      }
      local_20._M_head_impl = (SVGNode *)0x0;
      if (local_18 != (SVGNode *)0x0) {
        (*local_18->_vptr_SVGNode[1])();
      }
    }
  }
  SVGElement::build((SVGElement *)this);
  return;
}

Assistant:

void SVGUseElement::build()
{
    if(auto targetElement = getTargetElement(document())) {
        if(auto newElement = cloneTargetElement(targetElement)) {
            addChild(std::move(newElement));
        }
    }

    SVGGraphicsElement::build();
}